

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O1

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  RegularExpressionMatch match;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_278;
  size_type local_260;
  pointer local_258;
  undefined8 local_250;
  long local_248;
  pointer local_240;
  undefined8 local_238;
  RegularExpressionMatch local_230;
  
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0')
     && (iVar3 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::originRegex), iVar3 != 0)) {
    ReplaceOrigin::originRegex.regmust = (char *)0x0;
    ReplaceOrigin::originRegex.program = (char *)0x0;
    ReplaceOrigin::originRegex.progsize = 0;
    memset(&ReplaceOrigin::originRegex,0,0x20a);
    cmsys::RegularExpression::compile(&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originRegex);
  }
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::originCurlyRegex), iVar3 != 0)) {
    ReplaceOrigin::originCurlyRegex.regmust = (char *)0x0;
    ReplaceOrigin::originCurlyRegex.program = (char *)0x0;
    ReplaceOrigin::originCurlyRegex.progsize = 0;
    memset(&ReplaceOrigin::originCurlyRegex,0,0x20a);
    cmsys::RegularExpression::compile(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originCurlyRegex);
  }
  memset(&local_230,0,0x208);
  bVar2 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,(rpath->_M_dataplus)._M_p,&local_230);
  if (bVar2) {
    uVar4 = rpath->_M_string_length;
    uVar5 = (long)local_230.endp[1] - (long)local_230.searchstring;
    local_248 = uVar4 - uVar5;
    local_230.startp[0] = local_230.startp[1];
    if (uVar4 < uVar5) {
LAB_005c9093:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
  }
  else {
    bVar2 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,(rpath->_M_dataplus)._M_p,&local_230);
    if (!bVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (rpath->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + rpath->_M_string_length);
      return __return_storage_ptr__;
    }
    uVar4 = rpath->_M_string_length;
    uVar5 = (long)local_230.endp[0] - (long)local_230.searchstring;
    local_248 = uVar4 - uVar5;
    if (uVar4 < uVar5) goto LAB_005c9093;
  }
  local_278.first._M_len = (long)local_230.startp[0] - (long)local_230.searchstring;
  if (uVar4 < (ulong)((long)local_230.startp[0] - (long)local_230.searchstring)) {
    local_278.first._M_len = uVar4;
  }
  local_278.first._M_str = (rpath->_M_dataplus)._M_p;
  local_240 = local_278.first._M_str + uVar5;
  local_278.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_258 = (origin->_M_dataplus)._M_p;
  local_260 = origin->_M_string_length;
  local_250 = 0;
  local_238 = 0;
  views._M_len = 3;
  views._M_array = &local_278;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start(1));
    auto end = pathv.substr(match.end(1));
    return cmStrCat(begin, origin, end);
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start());
    auto end = pathv.substr(match.end());
    return cmStrCat(begin, origin, end);
  }
  return rpath;
}